

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::udf_covar_state_t,int,int,duckdb::UDFCovarPopOperation>
               (int *adata,AggregateInputData *aggr_input_data,int *bdata,udf_covar_state_t *state,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  bool bVar1;
  idx_t i;
  ulong uVar2;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
      local_58.lidx = uVar2;
      if (*(long *)asel != 0) {
        local_58.lidx = (idx_t)*(uint *)(*(long *)asel + uVar2 * 4);
      }
      local_58.ridx = uVar2;
      if (*(long *)bsel != 0) {
        local_58.ridx = (idx_t)*(uint *)(*(long *)bsel + uVar2 * 4);
      }
      UDFCovarOperation::Operation<int,int,duckdb::udf_covar_state_t,duckdb::UDFCovarPopOperation>
                (state,adata + local_58.lidx,bdata + local_58.ridx,&local_58);
    }
  }
  else {
    for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
      local_58.lidx = uVar2;
      if (*(long *)asel != 0) {
        local_58.lidx = (idx_t)*(uint *)(*(long *)asel + uVar2 * 4);
      }
      local_58.ridx = uVar2;
      if (*(long *)bsel != 0) {
        local_58.ridx = (idx_t)*(uint *)(*(long *)bsel + uVar2 * 4);
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,local_58.lidx);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,local_58.ridx);
        if (bVar1) {
          UDFCovarOperation::
          Operation<int,int,duckdb::udf_covar_state_t,duckdb::UDFCovarPopOperation>
                    (state,adata + local_58.lidx,bdata + local_58.ridx,&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}